

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmCTestResourceSpec> * __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<cmCTestResourceSpec>::
Bind<cmCTestResourceSpec,cmCTestResourceSpec::Socket,std::function<cmCTestResourceSpec::ReadFileResult(cmCTestResourceSpec::Socket&,Json::Value_const*)>>
          (Object<cmCTestResourceSpec> *this,string_view *name,
          offset_in_cmCTestResourceSpec_to_Socket member,
          function<cmCTestResourceSpec::ReadFileResult_(cmCTestResourceSpec::Socket_&,_const_Json::Value_*)>
          *func,bool required)

{
  Object<cmCTestResourceSpec> *pOVar1;
  MemberFunction local_70;
  anon_class_40_2_315d8239 local_50;
  
  std::
  function<cmCTestResourceSpec::ReadFileResult_(cmCTestResourceSpec::Socket_&,_const_Json::Value_*)>
  ::function(&local_50.func,func);
  local_50.member = member;
  std::function<cmCTestResourceSpec::ReadFileResult(cmCTestResourceSpec&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<cmCTestResourceSpec>::Bind<cmCTestResourceSpec,cmCTestResourceSpec::Socket,std::function<cmCTestResourceSpec::ReadFileResult(cmCTestResourceSpec::Socket&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,cmCTestResourceSpec::Socket_cmCTestResourceSpec::*,std::function<cmCTestResourceSpec::ReadFileResult(cmCTestResourceSpec::Socket&,Json::Value_const*)>,bool)::_lambda(cmCTestResourceSpec&,Json::Value_const*)_1_,void>
            ((function<cmCTestResourceSpec::ReadFileResult(cmCTestResourceSpec&,Json::Value_const*)>
              *)&local_70,&local_50);
  pOVar1 = BindPrivate(this,name,&local_70,required);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }